

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3mixw_io.c
# Opt level: O2

int s3mixw_read(char *fn,float32 ****out_mixw,uint32 *out_n_mixw,uint32 *out_n_feat,
               uint32 *out_n_density)

{
  int iVar1;
  int32 iVar2;
  FILE *fp;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint32 swap;
  uint32 rd_chksum;
  char *local_50;
  uint32 sv_chksum;
  uint *local_40;
  uint32 ignore;
  
  rd_chksum = 0;
  local_40 = out_n_density;
  fp = s3open(fn,"rb",&swap);
  iVar5 = -1;
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_50 = fn;
  pcVar3 = s3get_gvn_fattr("version");
  if (pcVar3 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
            ,0x51,"No version attribute for %s\n",local_50);
LAB_00106ef8:
    exit(1);
  }
  iVar1 = strcmp(pcVar3,"1.0");
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
            ,0x4d,"Version mismatch for %s, file ver: %s != reader ver: %s\n",local_50,pcVar3,"1.0")
    ;
    goto LAB_00106ef8;
  }
  pcVar4 = s3get_gvn_fattr("chksum0");
  iVar2 = bio_fread_3d(out_mixw,4,out_n_mixw,out_n_feat,local_40,fp,swap,&rd_chksum);
  pcVar3 = local_50;
  if (iVar2 < 0) {
LAB_00106e8b:
    s3close(fp);
  }
  else {
    if (pcVar4 != (char *)0x0) {
      iVar2 = bio_fread(&sv_chksum,4,1,fp,swap,&ignore);
      if (iVar2 != 1) goto LAB_00106e8b;
      if (sv_chksum != rd_chksum) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
                ,0x6e,"Checksum error; read corrupt data.\n");
        goto LAB_00106ef8;
      }
    }
    s3close(fp);
    iVar5 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
            ,0x75,"Read %s [%ux%ux%u array]\n",pcVar3,(ulong)*out_n_mixw,(ulong)*out_n_feat,
            (ulong)*local_40);
  }
  return iVar5;
}

Assistant:

int
s3mixw_read(const char *fn,
	    float32 ****out_mixw,
	    uint32 *out_n_mixw,
	    uint32 *out_n_feat,
	    uint32 *out_n_density)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 swap;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, MIXW_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, MIXW_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    /* Read the mixing weight array */
    if (bio_fread_3d((void ****)out_mixw,
		  sizeof(float32),
		  out_n_mixw,
		  out_n_feat,
		  out_n_density,
		  fp,
		  swap,
		  &rd_chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    return S3_ERROR;
	}

	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, *out_n_mixw, *out_n_feat, *out_n_density);

    return S3_SUCCESS;
}